

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeDeferredSeek(WhereInfo *pWInfo,Index *pIdx,int iCur,int iIdxCur)

{
  Parse *pPVar1;
  Vdbe *p;
  Table *pTVar2;
  int *zP4;
  Parse *local_50;
  int *ai;
  Table *pTab;
  int i;
  Vdbe *v;
  Parse *pParse;
  int iIdxCur_local;
  int iCur_local;
  Index *pIdx_local;
  WhereInfo *pWInfo_local;
  
  pPVar1 = pWInfo->pParse;
  p = pPVar1->pVdbe;
  sqlite3VdbeAddOp3(p,0x86,iIdxCur,0,iCur);
  if ((pWInfo->wctrlFlags & 0x20) != 0) {
    local_50 = pPVar1;
    if (pPVar1->pToplevel != (Parse *)0x0) {
      local_50 = pPVar1->pToplevel;
    }
    if (local_50->writeMask == 0) {
      pTVar2 = pIdx->pTable;
      zP4 = (int *)sqlite3DbMallocZero(pPVar1->db,(long)(pTVar2->nCol + 1) << 2);
      if (zP4 != (int *)0x0) {
        *zP4 = (int)pTVar2->nCol;
        for (pTab._4_4_ = 0; pTab._4_4_ < (int)(pIdx->nColumn - 1); pTab._4_4_ = pTab._4_4_ + 1) {
          if (-1 < pIdx->aiColumn[pTab._4_4_]) {
            zP4[pIdx->aiColumn[pTab._4_4_] + 1] = pTab._4_4_ + 1;
          }
        }
        sqlite3VdbeChangeP4(p,-1,(char *)zP4,-0xf);
      }
    }
  }
  return;
}

Assistant:

static void codeDeferredSeek(
  WhereInfo *pWInfo,              /* Where clause context */
  Index *pIdx,                    /* Index scan is using */
  int iCur,                       /* Cursor for IPK b-tree */
  int iIdxCur                     /* Index cursor */
){
  Parse *pParse = pWInfo->pParse; /* Parse context */
  Vdbe *v = pParse->pVdbe;        /* Vdbe to generate code within */

  assert( iIdxCur>0 );
  assert( pIdx->aiColumn[pIdx->nColumn-1]==-1 );
  
  sqlite3VdbeAddOp3(v, OP_DeferredSeek, iIdxCur, 0, iCur);
  if( (pWInfo->wctrlFlags & WHERE_OR_SUBCLAUSE)
   && DbMaskAllZero(sqlite3ParseToplevel(pParse)->writeMask)
  ){
    int i;
    Table *pTab = pIdx->pTable;
    int *ai = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*(pTab->nCol+1));
    if( ai ){
      ai[0] = pTab->nCol;
      for(i=0; i<pIdx->nColumn-1; i++){
        assert( pIdx->aiColumn[i]<pTab->nCol );
        if( pIdx->aiColumn[i]>=0 ) ai[pIdx->aiColumn[i]+1] = i+1;
      }
      sqlite3VdbeChangeP4(v, -1, (char*)ai, P4_INTARRAY);
    }
  }
}